

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O2

void __thiscall
mjs::object::define_accessor_property
          (object *this,string *name,object_ptr *accessor,property_attribute attr)

{
  uint __line;
  bool bVar1;
  property_attribute a;
  undefined8 *puVar2;
  property *this_00;
  gc_vector<mjs::object::property> *this_01;
  char *__assertion;
  wstring_view key;
  pair<mjs::object::property_*,_mjs::gc_vector<mjs::object::property>_*> pVar3;
  property_attribute local_b4;
  value local_b0;
  undefined1 local_88 [24];
  wchar_t *local_70;
  undefined8 local_50;
  wchar_t *local_48;
  undefined8 local_40;
  wchar_t *local_38;
  
  local_b4 = attr;
  bVar1 = is_valid(attr);
  if (!bVar1) {
    __assertion = "is_valid(attr)";
    __line = 0x2f;
    goto LAB_0014182c;
  }
  if ((accessor->super_gc_heap_ptr_untyped).heap_ != (gc_heap *)0x0) {
    gc_heap_ptr_untyped::get(&accessor->super_gc_heap_ptr_untyped);
    prototype((object *)local_88);
    if ((gc_heap *)local_88._0_8_ == (gc_heap *)0x0) {
      puVar2 = (undefined8 *)gc_heap_ptr_untyped::get(&accessor->super_gc_heap_ptr_untyped);
      local_40 = 3;
      local_38 = L"get";
      (**(code **)*puVar2)(&local_b0,puVar2);
      bVar1 = is_function(&local_b0);
      if (!bVar1) {
        puVar2 = (undefined8 *)gc_heap_ptr_untyped::get(&accessor->super_gc_heap_ptr_untyped);
        local_50 = 3;
        local_48 = L"set";
        (**(code **)*puVar2)(local_88 + 0x10,puVar2);
        bVar1 = is_function((value *)(local_88 + 0x10));
        if (!bVar1) goto LAB_001417e3;
        value::~value((value *)(local_88 + 0x10));
      }
      value::~value(&local_b0);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_88);
      puVar2 = (undefined8 *)gc_heap_ptr_untyped::get(&accessor->super_gc_heap_ptr_untyped);
      local_88._16_4_ = 3;
      local_88._20_4_ = 0;
      local_70 = L"set";
      (**(code **)*puVar2)(&local_b0,puVar2);
      value::~value(&local_b0);
      if (local_b0.type_ == undefined) {
        local_b4 = attr | (accessor|read_only);
      }
      else {
        local_b4 = operator~(read_only);
        local_b4 = local_b4 & (attr | accessor);
      }
      key = string::view(name);
      pVar3 = find(this,key);
      this_00 = pVar3.first;
      if (this_00 != (property *)0x0) {
        value::value(&local_b0,accessor);
        property::raw_put(this_00,&local_b0);
        value::~value(&local_b0);
        this_00->attributes_ = local_b4;
        return;
      }
      local_b0._0_16_ = string::view(name);
      a = (*this->_vptr_object[6])(this);
      bVar1 = is_valid(a);
      if (!bVar1) {
        this_01 = gc_heap_ptr_untracked<mjs::gc_vector<mjs::object::property>,_true>::dereference
                            (&this->properties_,this->heap_);
        value::value(&local_b0,accessor);
        gc_vector<mjs::object::property>::
        emplace_back<mjs::string_const&,mjs::value,mjs::property_attribute&>
                  (this_01,name,&local_b0,&local_b4);
        value::~value(&local_b0);
        return;
      }
      __assertion = "!is_valid(own_property_attributes(name.view()))";
      __line = 0x3c;
      goto LAB_0014182c;
    }
  }
LAB_001417e3:
  __assertion = 
  "accessor && !accessor->prototype() && (is_function(accessor->get(L\"get\")) || is_function(accessor->get(L\"set\")))"
  ;
  __line = 0x30;
LAB_0014182c:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/object.cpp",
                __line,
                "void mjs::object::define_accessor_property(const string &, const object_ptr &, property_attribute)"
               );
}

Assistant:

void object::define_accessor_property(const string& name, const object_ptr& accessor, property_attribute attr) {
    assert(is_valid(attr));
    assert(accessor && !accessor->prototype() && (is_function(accessor->get(L"get")) || is_function(accessor->get(L"set"))));
    attr |= property_attribute::accessor;
    if (accessor->get(L"set").type() != value_type::undefined) {
        attr &= ~property_attribute::read_only;
    } else {
        attr |= property_attribute::read_only;
    }
    if (auto it = find(name.view()).first) {
        it->raw_put(value{accessor});
        it->attributes(attr);
        return;
    }
    assert(!is_valid(own_property_attributes(name.view())));
    properties_.dereference(heap()).emplace_back(name, value{accessor}, attr);
}